

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Appearance_PDU::Decode(Appearance_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Appearance_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0;
  if ((local_19 & 1) != 0) {
    iVar2 = 0xc;
  }
  if (0x10 < (uint)KVar1 + iVar2) {
    LE_Header::Decode(&this->super_LE_Header,pKStack_18,(bool)(local_19 & 1));
    (this->m_AppearanceFlag1Union).m_ui8Flag = '\0';
    (this->m_AppearanceFlag2Union).m_ui8Flag = '\0';
    KDataStream::operator>>(pKStack_18,&(this->m_AppearanceFlag1Union).m_ui8Flag);
    if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
      KDataStream::operator>>(pKStack_18,&(this->m_AppearanceFlag2Union).m_ui8Flag);
    }
    if (((this->m_AppearanceFlag1Union).m_ui8Flag & 1) != 0) {
      KDataStream::operator>>(pKStack_18,&this->m_ui8ForceID);
    }
    if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 1 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_EntityType).super_DataTypeBase);
    }
    if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 2 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_AltEntityType).super_DataTypeBase);
    }
    if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 3 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_EntityMarking).super_DataTypeBase);
    }
    if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 4 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_EntityCapabilities).super_DataTypeBase);
    }
    if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 5 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_VisApp).super_DataTypeBase);
    }
    if (((this->m_AppearanceFlag1Union).m_ui8Flag >> 6 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_IRApp).super_DataTypeBase);
    }
    if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
      if (((this->m_AppearanceFlag2Union).m_ui8Flag & 1) != 0) {
        DATA_TYPE::operator>>(pKStack_18,&(this->m_EMApp).super_DataTypeBase);
      }
      if (((this->m_AppearanceFlag2Union).m_ui8Flag >> 1 & 1) != 0) {
        DATA_TYPE::operator>>(pKStack_18,&(this->m_AudApp).super_DataTypeBase);
      }
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Appearance_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < APPEARANCE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LE_Header::Decode( stream, ignoreHeader );

    // Reset flags
    m_AppearanceFlag1Union.m_ui8Flag = 0;
    m_AppearanceFlag2Union.m_ui8Flag = 0;

    stream >> m_AppearanceFlag1Union.m_ui8Flag;

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        stream >> m_AppearanceFlag2Union.m_ui8Flag;
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        stream >> m_ui8ForceID;
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        stream >> KDIS_STREAM m_EntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        stream >> KDIS_STREAM m_AltEntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        stream >> KDIS_STREAM m_EntityMarking;
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        stream >> KDIS_STREAM m_EntityCapabilities;
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        stream >> KDIS_STREAM m_VisApp;
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        stream >> KDIS_STREAM m_IRApp;
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            stream >> KDIS_STREAM m_EMApp;
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            stream >> KDIS_STREAM m_AudApp;
        }
    }
}